

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

int __thiscall QList<ProString>::remove(QList<ProString> *this,char *__filename)

{
  int in_EAX;
  int extraout_EAX;
  long in_RDX;
  
  if (in_RDX != 0) {
    QArrayDataPointer<ProString>::detach(&this->d,(QArrayDataPointer<ProString> *)0x0);
    QtPrivate::QMovableArrayOps<ProString>::erase
              ((QMovableArrayOps<ProString> *)this,(this->d).ptr + (long)__filename,in_RDX);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}